

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int tree_5_3::preOrder(Btree t)

{
  node **ppnVar1;
  code *pcVar2;
  bool local_cd;
  int local_cc;
  int top;
  Btree stack [22];
  Btree p;
  Btree t_local;
  
  stack[0x15] = t;
  local_cc = -1;
  do {
    for (; stack[0x15] != (Btree)0x0; stack[0x15] = stack[0x15]->left) {
      *(Btree *)(&stack0xffffffffffffff38 + (long)(local_cc + 1) * 8) = stack[0x15];
      local_cc = local_cc + 1;
    }
    stack[0x15] = *(Btree *)(&stack0xffffffffffffff38 + (long)local_cc * 8);
    printf("%c\t",(ulong)(uint)stack[0x15]->data);
    ppnVar1 = &stack[0x15]->right;
    stack[0x15] = *ppnVar1;
    local_cd = local_cc + -1 != -1 || *ppnVar1 != (node *)0x0;
    local_cc = local_cc + -1;
  } while (local_cd);
  puts("");
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

int preOrder(Btree t) {
        Btree p = t, stack[22];
        int top = -1;
        do {
            while (p != nullptr) {
                stack[++top] = p;
                p = p->left;
            }
            p = stack[top--];
            printf("%c\t", p->data);
            p = p->right;
        } while (top != -1 || p != nullptr);
        puts("");
    }